

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
int_writer<__int128>
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
           *this,back_insert_iterator<fmt::v6::detail::buffer<char>_> output,locale_ref loc,
          __int128 value,basic_format_specs<char> *s)

{
  char cVar1;
  byte bVar2;
  long in_R8;
  basic_format_specs<char> *in_R9;
  
  (this->out).container = output.container;
  (this->locale).locale_ = loc.locale_;
  this->specs = in_R9;
  *(long *)((long)&this->abs_value + 8) = in_R8;
  *(basic_format_specs<char> **)&this->abs_value = s;
  this->prefix_size = 0;
  if (-1 < in_R8) {
    bVar2 = (byte)in_R9->field_0x9 >> 4 & 7;
    if (1 < bVar2) {
      cVar1 = ' ';
      if (bVar2 == 2) {
        cVar1 = '+';
      }
      this->prefix[0] = cVar1;
      this->prefix_size = 1;
    }
    return;
  }
  this->prefix[0] = '-';
  this->prefix_size = 1;
  *(long *)&this->abs_value = -(long)s;
  *(ulong *)((long)&this->abs_value + 8) = -(ulong)(s != (basic_format_specs<char> *)0x0) - in_R8;
  return;
}

Assistant:

int_writer(OutputIt output, locale_ref loc, Int value,
             const basic_format_specs<Char>& s)
      : out(output),
        locale(loc),
        specs(s),
        abs_value(static_cast<UInt>(value)),
        prefix_size(0) {
    static_assert(std::is_same<uint32_or_64_or_128_t<Int>, UInt>::value, "");
    if (is_negative(value)) {
      prefix[0] = '-';
      ++prefix_size;
      abs_value = 0 - abs_value;
    } else if (specs.sign != sign::none && specs.sign != sign::minus) {
      prefix[0] = specs.sign == sign::plus ? '+' : ' ';
      ++prefix_size;
    }
  }